

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMNodeIteratorImpl.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::DOMNodeIteratorImpl::removeNode(DOMNodeIteratorImpl *this,DOMNode *node)

{
  DOMException *this_00;
  DOMNode *pDVar1;
  DOMNode *pDVar2;
  MemoryManager *local_68;
  DOMDocumentImpl *local_58;
  DOMNode *next;
  DOMNode *deleted;
  DOMNode *node_local;
  DOMNodeIteratorImpl *this_local;
  
  if ((this->fDetached & 1U) == 0) {
    if ((node != (DOMNode *)0x0) &&
       (pDVar1 = matchNodeOrParent(this,node), pDVar1 != (DOMNode *)0x0)) {
      if ((this->fForward & 1U) == 0) {
        pDVar2 = nextNode(this,pDVar1,false);
        if (pDVar2 == (DOMNode *)0x0) {
          pDVar1 = previousNode(this,pDVar1);
          this->fCurrentNode = pDVar1;
          this->fForward = true;
        }
        else {
          this->fCurrentNode = pDVar2;
        }
      }
      else {
        pDVar1 = previousNode(this,pDVar1);
        this->fCurrentNode = pDVar1;
      }
    }
    return;
  }
  this_00 = (DOMException *)__cxa_allocate_exception(0x28);
  if (this->fDocument == (DOMDocument *)0x0) {
    local_68 = XMLPlatformUtils::fgMemoryManager;
  }
  else {
    if (this->fDocument == (DOMDocument *)0x0) {
      local_58 = (DOMDocumentImpl *)0x0;
    }
    else {
      local_58 = (DOMDocumentImpl *)&this->fDocument[-1].super_DOMNode;
    }
    local_68 = DOMDocumentImpl::getMemoryManager(local_58);
  }
  DOMException::DOMException(this_00,0xb,0,local_68);
  __cxa_throw(this_00,&DOMException::typeinfo,DOMException::~DOMException);
}

Assistant:

void DOMNodeIteratorImpl::removeNode (DOMNode* node) {
	if (fDetached)
		throw DOMException(DOMException::INVALID_STATE_ERR, 0, GetDOMNodeIteratorMemoryManager);

    // Implementation note: Fix-up means setting the current node properly
    // after a remove.

    if (!node) return;

    DOMNode* deleted = matchNodeOrParent(node);

    if (!deleted) return;

    if (fForward) {
        fCurrentNode = previousNode(deleted);
    } else
    // if (!fForward)
    {
        DOMNode* next = nextNode(deleted, false);
        if (next != 0) {
            // normal case: there _are_ nodes following this in the iterator.
            fCurrentNode = next;
        } else {
            // the last node in the iterator is to be removed,
            // so we set the current node to be the previous one.
            fCurrentNode = previousNode(deleted);
            fForward = true;
        }

    }

}